

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3tokFilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                       sqlite3_value **apVal)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  uchar *__src;
  sqlite3_vtab *__dest;
  
  psVar1 = pCursor->pVtab;
  fts3tokResetCursor((Fts3tokCursor *)pCursor);
  if (idxNum == 1) {
    __src = sqlite3_value_text(*apVal);
    iVar2 = sqlite3_value_bytes(*apVal);
    __dest = (sqlite3_vtab *)sqlite3_malloc(iVar2 + 1);
    pCursor[1].pVtab = __dest;
    if (__dest == (sqlite3_vtab *)0x0) {
      iVar2 = 7;
    }
    else {
      memcpy(__dest,__src,(long)iVar2);
      *(undefined1 *)((long)&(pCursor[1].pVtab)->pModule + (long)iVar2) = 0;
      iVar2 = (*(psVar1[1].pModule)->xBestIndex)
                        (*(sqlite3_vtab **)&psVar1[1].nRef,(sqlite3_index_info *)pCursor[1].pVtab);
      if (iVar2 == 0) {
        (pCursor[2].pVtab)->pModule = *(sqlite3_module **)&psVar1[1].nRef;
        iVar2 = fts3tokNextMethod(pCursor);
        return iVar2;
      }
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int fts3tokFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_ERROR;
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;
  Fts3tokTable *pTab = (Fts3tokTable *)(pCursor->pVtab);
  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  fts3tokResetCursor(pCsr);
  if( idxNum==1 ){
    const char *zByte = (const char *)sqlite3_value_text(apVal[0]);
    int nByte = sqlite3_value_bytes(apVal[0]);
    pCsr->zInput = sqlite3_malloc(nByte+1);
    if( pCsr->zInput==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memcpy(pCsr->zInput, zByte, nByte);
      pCsr->zInput[nByte] = 0;
      rc = pTab->pMod->xOpen(pTab->pTok, pCsr->zInput, nByte, &pCsr->pCsr);
      if( rc==SQLITE_OK ){
        pCsr->pCsr->pTokenizer = pTab->pTok;
      }
    }
  }

  if( rc!=SQLITE_OK ) return rc;
  return fts3tokNextMethod(pCursor);
}